

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int luv_udp_set_membership(lua_State *L)

{
  uv_membership membership;
  uint status;
  uv_udp_t *handle;
  char *multicast_addr;
  char *interface_addr;
  int iVar1;
  int in_ESI;
  
  handle = luv_check_udp(L,in_ESI);
  multicast_addr = luaL_checklstring(L,2,(size_t *)0x0);
  iVar1 = 3;
  interface_addr = luaL_checklstring(L,3,(size_t *)0x0);
  membership = luaL_checkoption(L,4,(char *)0x0,luv_membership_opts);
  status = uv_udp_set_membership(handle,multicast_addr,interface_addr,membership);
  if ((int)status < 0) {
    luv_error(L,status);
  }
  else {
    lua_pushinteger(L,(ulong)status);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int luv_udp_set_membership(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  const char* multicast_addr = luaL_checkstring(L, 2);
  const char* interface_addr = luaL_checkstring(L, 3);
  uv_membership membership = (uv_membership)luaL_checkoption(L, 4, NULL, luv_membership_opts);
  int ret = uv_udp_set_membership(handle, multicast_addr, interface_addr, membership);
  return luv_result(L, ret);
}